

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_set_compression_pref(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  int iVar1;
  long lVar2;
  int *in_RDX;
  fitsfile *in_RSI;
  double dVar3;
  LONGLONG dataend;
  LONGLONG datastart;
  float hscale;
  double qvalue;
  char value [71];
  char card [81];
  long tiledim [6];
  int ivalue;
  int comptype;
  int nkeys;
  int naxis;
  int ii;
  int *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  fitsfile *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffedc;
  char local_118;
  char acStack_117 [79];
  long *in_stack_ffffffffffffff38;
  int *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff50;
  fitsfile *in_stack_ffffffffffffff58;
  int *in_stack_ffffffffffffff70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  int local_34;
  undefined4 local_30;
  int local_2c;
  int local_24;
  int *local_20;
  fitsfile *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  memset(&local_68,0,0x30);
  local_68 = 1;
  local_60 = 1;
  local_58 = 1;
  local_50 = 1;
  local_48 = 1;
  local_40 = 1;
  if (*local_20 < 1) {
    ffghadll((fitsfile *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             (LONGLONG *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (LONGLONG *)in_stack_fffffffffffffec8,
             (LONGLONG *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffeb8);
    if (0xffffffff <
        (long)in_stack_fffffffffffffec8 -
        CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)) {
      fits_set_huge_hdu(local_18,1,local_20);
    }
    ffghsp(in_stack_fffffffffffffec8,
           (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
           in_stack_fffffffffffffeb8,(int *)0x1f46a0);
    for (local_24 = 2; local_24 <= local_2c; local_24 = local_24 + 1) {
      ffgrec(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,(char *)in_stack_fffffffffffffeb8,
             (int *)0x1f46e3);
      iVar1 = strncmp(&stack0xffffffffffffff38,"FZ",2);
      if (iVar1 == 0) {
        ffpsvc((char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               in_stack_ffffffffffffff40);
        iVar1 = strncmp(&stack0xffffffffffffff3a,"ALGOR",5);
        if (iVar1 == 0) {
          iVar1 = fits_strncasecmp((char *)in_stack_fffffffffffffec8,
                                   (char *)CONCAT44(in_stack_fffffffffffffec4,
                                                    in_stack_fffffffffffffec0),
                                   (size_t)in_stack_fffffffffffffeb8);
          if (iVar1 == 0) {
            local_30 = 0xb;
          }
          else {
            iVar1 = fits_strncasecmp((char *)in_stack_fffffffffffffec8,
                                     (char *)CONCAT44(in_stack_fffffffffffffec4,
                                                      in_stack_fffffffffffffec0),
                                     (size_t)in_stack_fffffffffffffeb8);
            if (iVar1 == 0) {
              local_30 = 0x15;
            }
            else {
              iVar1 = fits_strncasecmp((char *)in_stack_fffffffffffffec8,
                                       (char *)CONCAT44(in_stack_fffffffffffffec4,
                                                        in_stack_fffffffffffffec0),
                                       (size_t)in_stack_fffffffffffffeb8);
              if (iVar1 == 0) {
                local_30 = 0x16;
              }
              else {
                iVar1 = fits_strncasecmp((char *)in_stack_fffffffffffffec8,
                                         (char *)CONCAT44(in_stack_fffffffffffffec4,
                                                          in_stack_fffffffffffffec0),
                                         (size_t)in_stack_fffffffffffffeb8);
                if (iVar1 == 0) {
                  local_30 = 0x1f;
                }
                else {
                  iVar1 = fits_strncasecmp((char *)in_stack_fffffffffffffec8,
                                           (char *)CONCAT44(in_stack_fffffffffffffec4,
                                                            in_stack_fffffffffffffec0),
                                           (size_t)in_stack_fffffffffffffeb8);
                  if (iVar1 == 0) {
                    local_30 = 0x29;
                  }
                  else {
                    iVar1 = fits_strncasecmp((char *)in_stack_fffffffffffffec8,
                                             (char *)CONCAT44(in_stack_fffffffffffffec4,
                                                              in_stack_fffffffffffffec0),
                                             (size_t)in_stack_fffffffffffffeb8);
                    if (iVar1 != 0) {
                      ffpmsg((char *)0x1f4851);
                      ffpmsg((char *)0x1f485b);
                      *local_20 = 0x19d;
                      return 0x19d;
                    }
                    local_30 = 0xffffffff;
                  }
                }
              }
            }
          }
          fits_set_compression_type
                    ((fitsfile *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int *)0x1f489f);
        }
        else {
          iVar1 = strncmp(&stack0xffffffffffffff3a,"TILE  ",6);
          if (iVar1 == 0) {
            iVar1 = fits_strncasecmp((char *)in_stack_fffffffffffffec8,
                                     (char *)CONCAT44(in_stack_fffffffffffffec4,
                                                      in_stack_fffffffffffffec0),
                                     (size_t)in_stack_fffffffffffffeb8);
            if (iVar1 == 0) {
              local_68 = 0xffffffffffffffff;
            }
            else {
              iVar1 = fits_strncasecmp((char *)in_stack_fffffffffffffec8,
                                       (char *)CONCAT44(in_stack_fffffffffffffec4,
                                                        in_stack_fffffffffffffec0),
                                       (size_t)in_stack_fffffffffffffeb8);
              if (iVar1 == 0) {
                local_68 = 0xffffffffffffffff;
                local_60 = 0xffffffffffffffff;
                local_58 = 0xffffffffffffffff;
              }
              else {
                in_stack_fffffffffffffeb8 = local_20;
                ffdtdm(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c
                       ,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                       in_stack_ffffffffffffff38,in_stack_ffffffffffffff70);
              }
            }
            fits_set_tile_dim((fitsfile *)
                              CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                              in_stack_fffffffffffffed4,(long *)in_stack_fffffffffffffec8,
                              (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
          }
          else {
            iVar1 = strncmp(&stack0xffffffffffffff3a,"QVALUE",6);
            if (iVar1 == 0) {
              dVar3 = atof(&local_118);
              fits_set_quantize_level(local_18,(float)dVar3,local_20);
            }
            else {
              iVar1 = strncmp(&stack0xffffffffffffff3a,"QMETHD",6);
              if (iVar1 == 0) {
                iVar1 = fits_strncasecmp((char *)in_stack_fffffffffffffec8,
                                         (char *)CONCAT44(in_stack_fffffffffffffec4,
                                                          in_stack_fffffffffffffec0),
                                         (size_t)in_stack_fffffffffffffeb8);
                if (iVar1 == 0) {
                  local_34 = -1;
                }
                else {
                  iVar1 = fits_strncasecmp((char *)in_stack_fffffffffffffec8,
                                           (char *)CONCAT44(in_stack_fffffffffffffec4,
                                                            in_stack_fffffffffffffec0),
                                           (size_t)in_stack_fffffffffffffeb8);
                  if (iVar1 == 0) {
                    local_34 = 1;
                  }
                  else {
                    iVar1 = fits_strncasecmp((char *)in_stack_fffffffffffffec8,
                                             (char *)CONCAT44(in_stack_fffffffffffffec4,
                                                              in_stack_fffffffffffffec0),
                                             (size_t)in_stack_fffffffffffffeb8);
                    if (iVar1 != 0) {
                      ffpmsg((char *)0x1f4a95);
                      ffpmsg((char *)0x1f4a9f);
                      *local_20 = 0x19d;
                      return 0x19d;
                    }
                    local_34 = 2;
                  }
                }
                fits_set_quantize_method
                          ((fitsfile *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                           ,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int *)0x1f4add);
              }
              else {
                iVar1 = strncmp(&stack0xffffffffffffff3a,"DTHRSD",6);
                if (iVar1 == 0) {
                  iVar1 = fits_strncasecmp((char *)in_stack_fffffffffffffec8,
                                           (char *)CONCAT44(in_stack_fffffffffffffec4,
                                                            in_stack_fffffffffffffec0),
                                           (size_t)in_stack_fffffffffffffeb8);
                  if (iVar1 == 0) {
                    local_34 = -1;
                  }
                  else {
                    iVar1 = fits_strncasecmp((char *)in_stack_fffffffffffffec8,
                                             (char *)CONCAT44(in_stack_fffffffffffffec4,
                                                              in_stack_fffffffffffffec0),
                                             (size_t)in_stack_fffffffffffffeb8);
                    if (iVar1 == 0) {
                      local_34 = 0;
                    }
                    else {
                      if (local_118 == '\'') {
                        lVar2 = atol(acStack_117);
                        local_34 = (int)lVar2;
                      }
                      else {
                        lVar2 = atol(&local_118);
                        local_34 = (int)lVar2;
                      }
                      if ((local_34 < 1) || (10000 < local_34)) {
                        ffpmsg((char *)0x1f4bb0);
                        ffpmsg((char *)0x1f4bba);
                        *local_20 = 0x19d;
                        return 0x19d;
                      }
                    }
                  }
                  fits_set_dither_seed
                            ((fitsfile *)
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                             (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int *)0x1f4bf8);
                }
                else {
                  iVar1 = strncmp(&stack0xffffffffffffff3a,"I2F",3);
                  if (iVar1 == 0) {
                    iVar1 = fits_strcasecmp((char *)in_stack_fffffffffffffec8,
                                            (char *)CONCAT44(in_stack_fffffffffffffec4,
                                                             in_stack_fffffffffffffec0));
                    if (iVar1 == 0) {
                      fits_set_lossy_int(local_18,1,local_20);
                    }
                    else {
                      iVar1 = fits_strcasecmp((char *)in_stack_fffffffffffffec8,
                                              (char *)CONCAT44(in_stack_fffffffffffffec4,
                                                               in_stack_fffffffffffffec0));
                      if (iVar1 != 0) {
                        ffpmsg((char *)0x1f4c90);
                        ffpmsg((char *)0x1f4c9a);
                        *local_20 = 0x19d;
                        return 0x19d;
                      }
                      fits_set_lossy_int(local_18,0,local_20);
                    }
                  }
                  else {
                    iVar1 = strncmp(&stack0xffffffffffffff3a,"HSCALE ",6);
                    if (iVar1 == 0) {
                      dVar3 = atof(&local_118);
                      in_stack_fffffffffffffedc = (float)dVar3;
                      fits_set_hcomp_scale(local_18,in_stack_fffffffffffffedc,local_20);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_4 = *local_20;
  }
  else {
    local_4 = *local_20;
  }
  return local_4;
}

Assistant:

int fits_set_compression_pref(
      fitsfile *infptr,
      fitsfile *outfptr,
      int *status) 
{
/*
   Set the preference for various compression options, based
   on keywords in the input file that
   provide guidance about how the HDU should be compressed when written
   to the output file.
*/

    int ii, naxis, nkeys, comptype;
    int  ivalue;
    long tiledim[6]= {1,1,1,1,1,1};
    char card[FLEN_CARD], value[FLEN_VALUE];
    double  qvalue;
    float hscale;
    LONGLONG datastart, dataend; 
    if (*status > 0)
        return(*status);

    /* check the size of the HDU that is to be compressed */
    fits_get_hduaddrll(infptr, NULL, &datastart, &dataend, status);
    if ( (LONGLONG)(dataend - datastart) > UINT32_MAX) {
       /* use 64-bit '1Q' variable length columns instead of '1P' columns */
       /* for large files, in case the heap size becomes larger than 2**32 bytes*/
       fits_set_huge_hdu(outfptr, 1, status);
    }

    fits_get_hdrspace(infptr, &nkeys, NULL, status);
 
   /* look for a image compression directive keywords (begin with 'FZ') */
    for (ii = 2; ii <= nkeys; ii++) {
        
	fits_read_record(infptr, ii, card, status);

	if (!strncmp(card, "FZ", 2) ){
	
            /* get the keyword value string */
            fits_parse_value(card, value, NULL, status);
	    
	    if      (!strncmp(card+2, "ALGOR", 5) ) {

	        /* set the desired compression algorithm */
                /* allowed values: RICE_1, GZIP_1, GZIP_2, PLIO_1,     */
                /*  HCOMPRESS_1, BZIP2_1, and NOCOMPRESS               */

                if        (!fits_strncasecmp(value, "'RICE_1", 7) ) {
		    comptype = RICE_1;
                } else if (!fits_strncasecmp(value, "'GZIP_1", 7) ) {
		    comptype = GZIP_1;
                } else if (!fits_strncasecmp(value, "'GZIP_2", 7) ) {
		    comptype = GZIP_2;
                } else if (!fits_strncasecmp(value, "'PLIO_1", 7) ) {
		    comptype = PLIO_1;
                } else if (!fits_strncasecmp(value, "'HCOMPRESS_1", 12) ) {
		    comptype = HCOMPRESS_1;
                } else if (!fits_strncasecmp(value, "'NONE", 5) ) {
		    comptype = NOCOMPRESS;
		} else {
			ffpmsg("Unknown FZALGOR keyword compression algorithm:");
			ffpmsg(value);
			return(*status = DATA_COMPRESSION_ERR);
		}  

	        fits_set_compression_type (outfptr, comptype, status);

	    } else if (!strncmp(card+2, "TILE  ", 6) ) {

                if (!fits_strncasecmp(value, "'row", 4) ) {
                   tiledim[0] = -1;
		} else if (!fits_strncasecmp(value, "'whole", 6) ) {
                   tiledim[0] = -1;
                   tiledim[1] = -1;
                   tiledim[2] = -1;
                } else {
		   ffdtdm(infptr, value, 0,6, &naxis, tiledim, status);
                }

	        /* set the desired tile size */
		fits_set_tile_dim (outfptr, 6, tiledim, status);

	    } else if (!strncmp(card+2, "QVALUE", 6) ) {

	        /* set the desired Q quantization value */
		qvalue = atof(value);
		fits_set_quantize_level (outfptr, (float) qvalue, status);

	    } else if (!strncmp(card+2, "QMETHD", 6) ) {

                    if (!fits_strncasecmp(value, "'no_dither", 10) ) {
                        ivalue = -1; /* just quantize, with no dithering */
		    } else if (!fits_strncasecmp(value, "'subtractive_dither_1", 21) ) {
                        ivalue = SUBTRACTIVE_DITHER_1; /* use subtractive dithering */
		    } else if (!fits_strncasecmp(value, "'subtractive_dither_2", 21) ) {
                        ivalue = SUBTRACTIVE_DITHER_2; /* dither, except preserve zero-valued pixels */
		    } else {
		        ffpmsg("Unknown value for FZQUANT keyword: (set_compression_pref)");
			ffpmsg(value);
                        return(*status = DATA_COMPRESSION_ERR);
		    }

		    fits_set_quantize_method(outfptr, ivalue, status);
		    
	    } else if (!strncmp(card+2, "DTHRSD", 6) ) {

                if (!fits_strncasecmp(value, "'checksum", 9) ) {
                    ivalue = -1; /* use checksum of first tile */
		} else if (!fits_strncasecmp(value, "'clock", 6) ) {
                    ivalue = 0; /* set dithering seed based on system clock */
		} else {  /* read integer value */
		    if (*value == '\'')
                        ivalue = (int) atol(value+1); /* allow for leading quote character */
                    else 
                        ivalue = (int) atol(value); 

                    if (ivalue < 1 || ivalue > 10000) {
		        ffpmsg("Invalid value for FZDTHRSD keyword: (set_compression_pref)");
			ffpmsg(value);
                        return(*status = DATA_COMPRESSION_ERR);
                    }
		}

	        /* set the desired dithering */
		fits_set_dither_seed(outfptr, ivalue, status);

	    } else if (!strncmp(card+2, "I2F", 3) ) {

	        /* set whether to convert integers to float then use lossy compression */
                if (!fits_strcasecmp(value, "t") ) {
		    fits_set_lossy_int (outfptr, 1, status);
		} else if (!fits_strcasecmp(value, "f") ) {
		    fits_set_lossy_int (outfptr, 0, status);
		} else {
		        ffpmsg("Unknown value for FZI2F keyword: (set_compression_pref)");
			ffpmsg(value);
                        return(*status = DATA_COMPRESSION_ERR);
                }

	    } else if (!strncmp(card+2, "HSCALE ", 6) ) {

	        /* set the desired Hcompress scale value */
		hscale = (float) atof(value);
		fits_set_hcomp_scale (outfptr, hscale, status);
            }
	}    
    }
    return(*status);
}